

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmParseTree.cpp
# Opt level: O3

uint32 Wasm::WasmTypes::GetTypeByteSize(WasmType type)

{
  uint32 uVar1;
  
  uVar1 = 8;
  switch(type) {
  case Void:
  case I64:
  case F64:
  case Ptr:
    break;
  case FirstLocalType:
  case F32:
    uVar1 = 4;
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    uVar1 = 0x10;
    break;
  default:
    Js::Throw::InternalError();
  }
  return uVar1;
}

Assistant:

uint32 GetTypeByteSize(WasmType type)
{
    switch (type)
    {
    case Void: return sizeof(Js::Var);
    case I32: return sizeof(int32);
    case I64: return sizeof(int64);
    case F32: return sizeof(float);
    case F64: return sizeof(double);
#ifdef ENABLE_WASM_SIMD
    case V128:
        Simd::EnsureSimdIsEnabled();
        CompileAssert(sizeof(Simd::simdvec) == 16);
        return sizeof(Simd::simdvec);
#endif
    case Ptr: return sizeof(void*);
    default:
        Js::Throw::InternalError();
    }
}